

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1Parser.h
# Opt level: O2

int64_t __thiscall VC1Unit::vc1_escape_buffer(VC1Unit *this,uint8_t *dst)

{
  uint8_t *puVar1;
  byte *pbVar2;
  uint8_t *__dest;
  size_t __n;
  byte *pbVar3;
  byte *__src;
  byte *pbVar4;
  
  __src = this->m_nalBuffer;
  pbVar4 = __src + this->m_nalBufferLen;
  pbVar2 = __src + 2;
  puVar1 = dst;
  while (__dest = puVar1, pbVar3 = pbVar2, pbVar3 < pbVar4) {
    puVar1 = __dest;
    if (*pbVar3 < 4) {
      if ((pbVar3[-2] == 0) && (pbVar3[-1] == 0)) {
        __n = (long)pbVar3 - (long)__src;
        memcpy(__dest,__src,__n);
        puVar1 = __dest + __n;
        *puVar1 = '\x03';
        __src = pbVar3 + 1;
        puVar1[1] = *pbVar3;
        pbVar2 = __src;
        puVar1 = puVar1 + 2;
        if (__src < pbVar4) {
          __src = pbVar3 + 2;
          __dest[__n + 2] = pbVar3[1];
          pbVar2 = __src;
          puVar1 = __dest + __n + 3;
        }
      }
      else {
        pbVar2 = pbVar3 + 1;
      }
    }
    else {
      pbVar2 = pbVar3 + 3;
    }
  }
  memcpy(__dest,__src,(long)pbVar4 - (long)__src);
  return (int64_t)(__dest + (((long)pbVar4 - (long)__src) - (long)dst));
}

Assistant:

int64_t vc1_escape_buffer(uint8_t* dst) const
    {
        const uint8_t* srcStart = m_nalBuffer;
        const uint8_t* initDstBuffer = dst;
        const uint8_t* srcBuffer = m_nalBuffer;
        const uint8_t* srcEnd = m_nalBuffer + m_nalBufferLen;
        for (srcBuffer += 2; srcBuffer < srcEnd;)
        {
            if (*srcBuffer > 3)
                srcBuffer += 3;
            else if (srcBuffer[-2] == 0 && srcBuffer[-1] == 0)
            {
                memcpy(dst, srcStart, srcBuffer - srcStart);
                dst += srcBuffer - srcStart;
                *dst++ = 3;
                *dst++ = *srcBuffer++;
                for (int k = 0; k < 1; k++)
                    if (srcBuffer < srcEnd)
                    {
                        *dst++ = *srcBuffer++;
                    }
                srcStart = srcBuffer;
            }
            else
                srcBuffer++;
        }
        memcpy(dst, srcStart, srcEnd - srcStart);
        dst += srcEnd - srcStart;
        return dst - initDstBuffer;
    }